

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_state.cc
# Opt level: O0

void __thiscall hanabi_learning_env::HanabiState::AdvanceToNextPlayer(HanabiState *this)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  long in_RDI;
  HanabiState *in_stack_00000008;
  
  bVar1 = HanabiDeck::Empty((HanabiDeck *)(in_RDI + 8));
  if ((!bVar1) && (iVar2 = PlayerToDeal(in_stack_00000008), -1 < iVar2)) {
    *(undefined4 *)(in_RDI + 0x70) = 0xffffffff;
    return;
  }
  *(undefined4 *)(in_RDI + 0x70) = *(undefined4 *)(in_RDI + 0x74);
  iVar2 = *(int *)(in_RDI + 0x70);
  sVar3 = std::
          vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
          ::size((vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
                  *)(in_RDI + 0x40));
  *(int *)(in_RDI + 0x74) = (int)((ulong)(long)(iVar2 + 1) % sVar3);
  return;
}

Assistant:

void HanabiState::AdvanceToNextPlayer() {
  if (!deck_.Empty() && PlayerToDeal() >= 0) {
    cur_player_ = kChancePlayerId;
  } else {
    cur_player_ = next_non_chance_player_;
    next_non_chance_player_ = (cur_player_ + 1) % hands_.size();
  }
}